

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

logic_t slang::SVInt::logicalImpl(SVInt *lhs,SVInt *rhs)

{
  logic_t lVar1;
  logic_t in_stack_00000026;
  SVInt *in_stack_ffffffffffffffd8;
  
  operator!(in_stack_ffffffffffffffd8);
  lVar1 = slang::operator||(in_stack_00000026,lhs);
  return (logic_t)lVar1.value;
}

Assistant:

inline logic_t SVInt::logicalImpl(const SVInt& lhs, const SVInt& rhs) {
    return !lhs || rhs;
}